

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

int __thiscall V2Synth::init(V2Synth *this,EVP_PKEY_CTX *ctx)

{
  uint32_t in_EDX;
  int local_24;
  int local_20;
  int i_1;
  int i;
  int samplerate_local;
  void *patchmap_local;
  V2Synth *this_local;
  
  memset(this,0,0x280650);
  this->samplerate = in_EDX;
  V2Instance::calcNewSampleRate(&this->instance,in_EDX);
  ronanCBSetSR((syWRonan *)&this->ronan,in_EDX);
  this->patchmap = (V2PatchMap *)ctx;
  for (local_20 = 0; local_20 < 0x40; local_20 = local_20 + 1) {
    this->chanmap[local_20] = -1;
    V2Voice::init(this->voicesw + local_20,(EVP_PKEY_CTX *)&this->instance);
  }
  for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
    this->chans[local_24].ctl[6] = '\x7f';
    V2Chan::init(this->chansw + local_24,(EVP_PKEY_CTX *)&this->instance);
  }
  V2Reverb::init(&this->reverb,(EVP_PKEY_CTX *)&this->instance);
  V2ModDel::init(&this->delay,(EVP_PKEY_CTX *)&this->instance);
  ronanCBInit((syWRonan *)&this->ronan);
  V2Comp::init(&this->compr,(EVP_PKEY_CTX *)&this->instance);
  V2DCFilter::init(&this->dcf,(EVP_PKEY_CTX *)&this->instance);
  this->initialized = true;
  return (int)this;
}

Assistant:

void init(const void *patchmap, int samplerate)
    {
        // Ahem, so this is somewhat dubious, but we don't use
        // virtual functions or anything so it should be fine. Ahem.
        // Look away please :)
        memset(this, 0, sizeof(*this));

        // set sampling rate
        this->samplerate = samplerate;
        instance.calcNewSampleRate(samplerate);
        ronanCBSetSR(&ronan, samplerate);

        // patch map
        this->patchmap = (const V2PatchMap*)patchmap;

        // init voices
        for (int i = 0; i < POLY; i++)
        {
            chanmap[i] = -1;
            voicesw[i].init(&instance);
        }

        // init channels
        for (int i = 0; i < CHANS; i++)
        {
            chans[i].ctl[6] = 0x7f;
            chansw[i].init(&instance, chandelbuf[i][0], chandelbuf[i][1], COUNTOF(chandelbuf[i][0]));
        }

        // global filters
        reverb.init(&instance);
        delay.init(&instance, maindelbuf[0], maindelbuf[1], COUNTOF(maindelbuf[0]));
        ronanCBInit(&ronan);
        compr.init(&instance);
        dcf.init(&instance);

        // debug plots (uncomment the ones you want)
        //int sr_plot = 44100/10; // plot rate
        //int sr_lfo = 800;
        //int w = 800, h = 150;

        //DEBUG_PLOT_OPEN(&voicesw[1].osc[0], "Voice 1 VCO 0", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(&voicesw[1].osc[1], "Voice 1 VCO 1", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(&voicesw[1].vcf[0], "Voice 1 VCF 0", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(&voicesw[1].env[0], "Voice 1 Env 0", sr_lfo, w, h);
        //DEBUG_PLOT_OPEN(&voicesw[1].lfo[0], "Voice 1 LFO 0", sr_lfo, w, h);
        //DEBUG_PLOT_OPEN(&voicesw[1].dist, "Voice 1 Dist", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(&voicesw[1], "Voice 1 final", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(DEBUG_PLOT_CHAN(&chansw[0].dcf1, 0), "Chan 0 DCF1 L", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(DEBUG_PLOT_CHAN(&chansw[0].dcf1, 1), "Chan 0 DCF1 R", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(DEBUG_PLOT_CHAN(&chansw[0], 0), "Channel 0 L", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(DEBUG_PLOT_CHAN(&chansw[0], 1), "Channel 0 R", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(DEBUG_PLOT_CHAN(&instance.mixbuf, 0), "Mix L", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(DEBUG_PLOT_CHAN(&instance.mixbuf, 1), "Mix R", sr_plot, w, h);

        initialized = true;
    }